

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussPoint.cpp
# Opt level: O1

void __thiscall chrono::fea::ChGaussPoint::SetCoordinates(ChGaussPoint *this,ChVector<double> *c)

{
  ChVector<double> *pCVar1;
  
  pCVar1 = this->m_coordinates;
  if (pCVar1 == (ChVector<double> *)0x0) {
    pCVar1 = (ChVector<double> *)::operator_new(0x18);
    pCVar1->m_data[0] = c->m_data[0];
    pCVar1->m_data[1] = c->m_data[1];
    pCVar1->m_data[2] = c->m_data[2];
    this->m_coordinates = pCVar1;
  }
  else if (pCVar1 != c) {
    pCVar1->m_data[0] = c->m_data[0];
    pCVar1->m_data[1] = c->m_data[1];
    pCVar1->m_data[2] = c->m_data[2];
  }
  return;
}

Assistant:

void ChGaussPoint::SetCoordinates(const ChVector<>& c) {
    if (m_coordinates) {
        *m_coordinates = c;
    } else {
        m_coordinates = new ChVector<>(c);
    }
}